

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::statement<char_const*&,char_const(&)[36]>
          (CompilerGLSL *this,char **ts,char (*ts_1) [36])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint local_44;
  spirv_cross local_40 [4];
  uint32_t i;
  char (*local_20) [36];
  char (*ts_local_1) [36];
  char **ts_local;
  CompilerGLSL *this_local;
  
  local_20 = ts_1;
  ts_local_1 = (char (*) [36])ts;
  ts_local = (char **)this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_44 = 0; local_44 < this->indent; local_44 = local_44 + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<char_const*&,char_const(&)[36]>(this,(char **)ts_local_1,local_20);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<char_const*&,char_const(&)[36]>(local_40,(char **)ts_local_1,local_20);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
    ::std::__cxx11::string::~string((string *)local_40);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}